

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRFormatInformation.cpp
# Opt level: O2

FormatInformation
ZXing::QRCode::FormatInformation::DecodeRMQR(uint32_t formatInfoBits1,uint32_t formatInfoBits2)

{
  ErrorCorrectionLevel EVar1;
  ulong uVar2;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  FormatInformation FVar3;
  allocator_type local_5a;
  allocator_type local_59;
  uint32_t local_58;
  uint32_t local_54;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  local_54 = formatInfoBits1;
  if (formatInfoBits2 == 0) {
    __l_01._M_len = 1;
    __l_01._M_array = &local_54;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50,__l_01,
               (allocator_type *)&local_58);
    local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    __l._M_len = 1;
    __l._M_array = &local_54;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50,__l,&local_59);
    __l_00._M_len = 1;
    __l_00._M_array = &local_58;
    local_58 = formatInfoBits2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,__l_00,&local_5a);
  }
  FVar3 = FindBestFormatInfoRMQR
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_50);
  EVar1 = ECLevelFromBits(FVar3._4_4_ >> 4 & 2,false);
  uVar2 = FVar3._0_8_ & 0xffffffffffffff;
  FVar3._8_8_ = (ulong)(FVar3._3_4_ & 0x1f00) + (CONCAT44(EVar1,FVar3._8_4_) & 0xffffffffffff0000) +
                0x104;
  FVar3.mask = (int)uVar2;
  FVar3.data = (char)(uVar2 >> 0x20);
  FVar3.hammingDistance = (char)(uVar2 >> 0x28);
  FVar3.bitsIndex = (char)(uVar2 >> 0x30);
  FVar3.isMirrored = (bool)(char)(uVar2 >> 0x38);
  return FVar3;
}

Assistant:

FormatInformation FormatInformation::DecodeRMQR(uint32_t formatInfoBits1, uint32_t formatInfoBits2)
{
	FormatInformation fi;
	if (formatInfoBits2)
		fi = FindBestFormatInfoRMQR({formatInfoBits1}, {formatInfoBits2});
	else // TODO probably remove if `sampleRMQR()` done properly
		fi = FindBestFormatInfoRMQR({formatInfoBits1}, {});

	// Bit 6 is error correction (M/H), and bits 0-5 version.
	fi.ecLevel = ECLevelFromBits(((fi.data >> 5) & 1) << 1); // Shift to match QRCode M/H
	fi.dataMask = 4; // ((y / 2) + (x / 3)) % 2 == 0
	fi.microVersion = (fi.data & 0x1F) + 1;
	fi.isMirrored = false; // TODO: implement mirrored format bit reading

	return fi;
}